

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O0

string * EncodeSecret_abi_cxx11_(CKey *key)

{
  long lVar1;
  const_iterator __position;
  Span<const_unsigned_char> input;
  bool bVar2;
  iterator iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  byte *__first;
  uchar *__last;
  string *in_RDI;
  long in_FS_OFFSET;
  string *ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  CKey *in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  CChainParams *in_stack_ffffffffffffff38;
  string *this;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  size_t in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar2 = CKey::IsValid(in_stack_ffffffffffffff28);
  if (!bVar2) {
    __assert_fail("key.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/key_io.cpp"
                  ,0xe9,"std::string EncodeSecret(const CKey &)");
  }
  Params();
  CChainParams::Base58Prefix
            (in_stack_ffffffffffffff38,(Base58Type)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_ffffffffffffff30)
  ;
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_ffffffffffffff38,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_ffffffffffffff30);
  CKey::begin(in_stack_ffffffffffffff28);
  pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           UCharCast(&in_stack_ffffffffffffff28->fCompressed);
  __first = CKey::end((CKey *)in_stack_ffffffffffffff38);
  __last = UCharCast(&in_stack_ffffffffffffff28->fCompressed);
  __position._M_current._7_1_ = in_stack_ffffffffffffff8f;
  __position._M_current._0_7_ = in_stack_ffffffffffffff88;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            (pvVar4,__position,__first,__last);
  bVar2 = CKey::IsCompressed(in_stack_ffffffffffffff28);
  if (bVar2) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28,
               (value_type_conflict *)0x1f3c4f);
  }
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  input.m_size = in_stack_ffffffffffffffd8;
  input.m_data = iVar3._M_current;
  EncodeBase58Check_abi_cxx11_(input);
  pvVar4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_ffffffffffffff28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28);
  memory_cleanse(in_stack_ffffffffffffff28,0x1f3cd4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(pvVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeSecret(const CKey& key)
{
    assert(key.IsValid());
    std::vector<unsigned char> data = Params().Base58Prefix(CChainParams::SECRET_KEY);
    data.insert(data.end(), UCharCast(key.begin()), UCharCast(key.end()));
    if (key.IsCompressed()) {
        data.push_back(1);
    }
    std::string ret = EncodeBase58Check(data);
    memory_cleanse(data.data(), data.size());
    return ret;
}